

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fDebugMarkerTests.cpp
# Opt level: O0

TestCaseGroup * deqp::gles2::Functional::createDebugMarkerTests(Context *context)

{
  TestCaseGroup *pTVar1;
  TestContext *testCtx;
  TestNode *pTVar2;
  TestNode *pTVar3;
  DefaultDeleter<tcu::TestCaseGroup> local_2d [13];
  undefined1 local_20 [8];
  MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> debugMarkerGroup;
  Context *context_local;
  
  debugMarkerGroup.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
  m_data._8_8_ = context;
  pTVar1 = (TestCaseGroup *)operator_new(0x70);
  testCtx = Context::getTestContext
                      ((Context *)
                       debugMarkerGroup.
                       super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
                       .m_data._8_8_);
  tcu::TestCaseGroup::TestCaseGroup(pTVar1,testCtx,"debug_marker","GL_EXT_debug_marker tests");
  de::DefaultDeleter<tcu::TestCaseGroup>::DefaultDeleter(local_2d);
  de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::MovePtr
            ((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)local_20,pTVar1
            );
  pTVar2 = &de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
            operator->((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                       local_20)->super_TestNode;
  pTVar3 = (TestNode *)operator_new(0x78);
  anon_unknown_0::IsSupportedCase::IsSupportedCase
            ((IsSupportedCase *)pTVar3,
             (Context *)
             debugMarkerGroup.
             super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
             _8_8_);
  tcu::TestNode::addChild(pTVar2,pTVar3);
  pTVar2 = &de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
            operator->((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                       local_20)->super_TestNode;
  pTVar3 = (TestNode *)operator_new(0x78);
  anon_unknown_0::RandomCase::RandomCase
            ((RandomCase *)pTVar3,
             (Context *)
             debugMarkerGroup.
             super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
             _8_8_);
  tcu::TestNode::addChild(pTVar2,pTVar3);
  pTVar2 = &de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
            operator->((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                       local_20)->super_TestNode;
  pTVar3 = (TestNode *)operator_new(0x78);
  anon_unknown_0::InvalidCase::InvalidCase
            ((InvalidCase *)pTVar3,
             (Context *)
             debugMarkerGroup.
             super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
             _8_8_);
  tcu::TestNode::addChild(pTVar2,pTVar3);
  pTVar1 = de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
           release((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)local_20)
  ;
  de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::~MovePtr
            ((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)local_20);
  return pTVar1;
}

Assistant:

tcu::TestCaseGroup* createDebugMarkerTests (Context& context)
{
	de::MovePtr<tcu::TestCaseGroup>	debugMarkerGroup	(new tcu::TestCaseGroup(context.getTestContext(), "debug_marker", "GL_EXT_debug_marker tests"));

	debugMarkerGroup->addChild(new IsSupportedCase	(context));
	debugMarkerGroup->addChild(new RandomCase		(context));
	debugMarkerGroup->addChild(new InvalidCase		(context));

	return debugMarkerGroup.release();
}